

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  uVar6 = iVar4 - 0x97;
  if (uVar6 < 0xf) {
    if ((0x78U >> (uVar6 & 0x1f) & 1) == 0) {
      if ((7U >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0x6000U >> (uVar6 & 0x1f) & 1) != 0) {
          Output::Print(L" R%d[R%d]",(ulong)data->Instance,(ulong)data->Element);
          return;
        }
        goto LAB_007ff577;
      }
      goto LAB_007ff5a8;
    }
  }
  else {
LAB_007ff577:
    if ((0x3f < iVar4 - 0x117U) ||
       ((0xe000000000000019U >> ((ulong)(iVar4 - 0x117U) & 0x3f) & 1) == 0)) {
      if (iVar4 != 0x2b) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x20b,"(false)","Unknown OpCode for OpLayoutElementI");
        if (bVar5) {
          *puVar7 = 0;
          return;
        }
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
LAB_007ff5a8:
      uVar6 = data->Value;
      uVar2 = data->Instance;
      uVar1 = data->Element;
      form = L" R%d = R%d[R%d]";
      goto LAB_007ff5b7;
    }
  }
  uVar1 = data->Value;
  uVar6 = data->Instance;
  uVar2 = data->Element;
  form = L" R%d[R%d] = R%d";
LAB_007ff5b7:
  Output::Print(form,(ulong)uVar6,(ulong)uVar2,(ulong)uVar1);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementI(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::ProfiledLdElemI_A:
            case OpCode::LdElemI_A:
            case OpCode::LdMethodElem:
            case OpCode::TypeofElem:
            {
                Output::Print(_u(" R%d = R%d[R%d]"), data->Value, data->Instance, data->Element);
                break;
            }
            case OpCode::ProfiledStElemI_A:
            case OpCode::ProfiledStElemI_A_Strict:
            case OpCode::StElemI_A:
            case OpCode::StElemI_A_Strict:
            case OpCode::InitSetElemI:
            case OpCode::InitGetElemI:
            case OpCode::InitComputedProperty:
            case OpCode::InitClassMemberComputedName:
            case OpCode::InitClassMemberGetComputedName:
            case OpCode::InitClassMemberSetComputedName:
            {
                Output::Print(_u(" R%d[R%d] = R%d"), data->Instance, data->Element, data->Value);
                break;
            }
            case OpCode::DeleteElemI_A:
            case OpCode::DeleteElemIStrict_A:
            {
                Output::Print(_u(" R%d[R%d]"), data->Instance, data->Element);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementI");
                break;
            }
        }
    }